

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_ldrddi.cpp
# Opt level: O0

ze_result_t
loader::zeModuleGetFunctionPointer
          (ze_module_handle_t hModule,char *pFunctionName,void **pfnFunction)

{
  ze_pfnModuleGetFunctionPointer_t pfnGetFunctionPointer;
  dditable_t *dditable;
  ze_result_t result;
  void **pfnFunction_local;
  char *pFunctionName_local;
  ze_module_handle_t hModule_local;
  
  if (*(code **)(*(long *)(hModule + 8) + 0x530) == (code *)0x0) {
    hModule_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  else {
    hModule_local._4_4_ =
         (**(code **)(*(long *)(hModule + 8) + 0x530))
                   (*(undefined8 *)hModule,pFunctionName,pfnFunction);
  }
  return hModule_local._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeModuleGetFunctionPointer(
        ze_module_handle_t hModule,                     ///< [in] handle of the module
        const char* pFunctionName,                      ///< [in] Name of function to retrieve function pointer for.
        void** pfnFunction                              ///< [out] pointer to function.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // extract driver's function pointer table
        auto dditable = reinterpret_cast<ze_module_object_t*>( hModule )->dditable;
        auto pfnGetFunctionPointer = dditable->ze.Module.pfnGetFunctionPointer;
        if( nullptr == pfnGetFunctionPointer )
            return ZE_RESULT_ERROR_UNINITIALIZED;

        // convert loader handle to driver handle
        hModule = reinterpret_cast<ze_module_object_t*>( hModule )->handle;

        // forward to device-driver
        result = pfnGetFunctionPointer( hModule, pFunctionName, pfnFunction );

        return result;
    }